

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O1

static_string_view cmFileSetVisibilityToName(cmFileSetVisibility vis)

{
  static_string_view sVar1;
  static_string_view sVar2;
  static_string_view sVar3;
  
  if (vis == Private) {
    sVar3.super_string_view._M_str = "PRIVATE";
    sVar3.super_string_view._M_len = 7;
    return (static_string_view)sVar3.super_string_view;
  }
  if (vis != Interface) {
    if (vis == Public) {
      sVar1.super_string_view._M_str = "PUBLIC";
      sVar1.super_string_view._M_len = 6;
      return (static_string_view)sVar1.super_string_view;
    }
    return (string_view)(ZEXT816(0x8618f5) << 0x40);
  }
  sVar2.super_string_view._M_str = "INTERFACE";
  sVar2.super_string_view._M_len = 9;
  return (static_string_view)sVar2.super_string_view;
}

Assistant:

cm::static_string_view cmFileSetVisibilityToName(cmFileSetVisibility vis)
{
  switch (vis) {
    case cmFileSetVisibility::Interface:
      return "INTERFACE"_s;
    case cmFileSetVisibility::Public:
      return "PUBLIC"_s;
    case cmFileSetVisibility::Private:
      return "PRIVATE"_s;
  }
  return ""_s;
}